

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::AddQuad(ImDrawList *this,ImVec2 *a,ImVec2 *b,ImVec2 *c,ImVec2 *d,ImU32 col,
                   float thickness)

{
  int *piVar1;
  int iVar2;
  ImVec2 *pIVar3;
  ImGuiContext *pIVar4;
  ImVec2 *pIVar5;
  int iVar6;
  int iVar7;
  
  pIVar4 = GImGui;
  if (col < 0x1000000) {
    return;
  }
  iVar2 = (this->_Path).Size;
  if (iVar2 == (this->_Path).Capacity) {
    if (iVar2 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar2 / 2 + iVar2;
    }
    iVar7 = iVar2 + 1;
    if (iVar2 + 1 < iVar6) {
      iVar7 = iVar6;
    }
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    pIVar3 = (ImVec2 *)(*(pIVar4->IO).MemAllocFn)((long)iVar7 << 3);
    pIVar5 = (this->_Path).Data;
    if (pIVar5 == (ImVec2 *)0x0) {
LAB_0014e2f5:
      pIVar5 = (ImVec2 *)0x0;
      pIVar4 = GImGui;
    }
    else {
      memcpy(pIVar3,pIVar5,(long)(this->_Path).Size << 3);
      pIVar4 = GImGui;
      pIVar5 = (this->_Path).Data;
      if (pIVar5 == (ImVec2 *)0x0) goto LAB_0014e2f5;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
    }
    (*(pIVar4->IO).MemFreeFn)(pIVar5);
    (this->_Path).Data = pIVar3;
    (this->_Path).Capacity = iVar7;
    iVar2 = (this->_Path).Size;
  }
  else {
    pIVar3 = (this->_Path).Data;
  }
  (this->_Path).Size = iVar2 + 1;
  pIVar3[iVar2] = *a;
  pIVar4 = GImGui;
  iVar2 = (this->_Path).Size;
  if (iVar2 == (this->_Path).Capacity) {
    if (iVar2 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar2 / 2 + iVar2;
    }
    iVar7 = iVar2 + 1;
    if (iVar2 + 1 < iVar6) {
      iVar7 = iVar6;
    }
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    pIVar3 = (ImVec2 *)(*(pIVar4->IO).MemAllocFn)((long)iVar7 << 3);
    pIVar5 = (this->_Path).Data;
    if (pIVar5 == (ImVec2 *)0x0) {
LAB_0014e39c:
      pIVar5 = (ImVec2 *)0x0;
      pIVar4 = GImGui;
    }
    else {
      memcpy(pIVar3,pIVar5,(long)(this->_Path).Size << 3);
      pIVar4 = GImGui;
      pIVar5 = (this->_Path).Data;
      if (pIVar5 == (ImVec2 *)0x0) goto LAB_0014e39c;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
    }
    (*(pIVar4->IO).MemFreeFn)(pIVar5);
    (this->_Path).Data = pIVar3;
    (this->_Path).Capacity = iVar7;
    iVar2 = (this->_Path).Size;
  }
  else {
    pIVar3 = (this->_Path).Data;
  }
  (this->_Path).Size = iVar2 + 1;
  pIVar3[iVar2] = *b;
  pIVar4 = GImGui;
  iVar2 = (this->_Path).Size;
  if (iVar2 == (this->_Path).Capacity) {
    if (iVar2 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar2 / 2 + iVar2;
    }
    iVar7 = iVar2 + 1;
    if (iVar2 + 1 < iVar6) {
      iVar7 = iVar6;
    }
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    pIVar3 = (ImVec2 *)(*(pIVar4->IO).MemAllocFn)((long)iVar7 << 3);
    pIVar5 = (this->_Path).Data;
    if (pIVar5 == (ImVec2 *)0x0) {
LAB_0014e443:
      pIVar5 = (ImVec2 *)0x0;
      pIVar4 = GImGui;
    }
    else {
      memcpy(pIVar3,pIVar5,(long)(this->_Path).Size << 3);
      pIVar4 = GImGui;
      pIVar5 = (this->_Path).Data;
      if (pIVar5 == (ImVec2 *)0x0) goto LAB_0014e443;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
    }
    (*(pIVar4->IO).MemFreeFn)(pIVar5);
    (this->_Path).Data = pIVar3;
    (this->_Path).Capacity = iVar7;
    iVar2 = (this->_Path).Size;
  }
  else {
    pIVar3 = (this->_Path).Data;
  }
  (this->_Path).Size = iVar2 + 1;
  pIVar3[iVar2] = *c;
  pIVar4 = GImGui;
  iVar2 = (this->_Path).Size;
  if (iVar2 == (this->_Path).Capacity) {
    if (iVar2 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar2 / 2 + iVar2;
    }
    iVar7 = iVar2 + 1;
    if (iVar2 + 1 < iVar6) {
      iVar7 = iVar6;
    }
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    pIVar3 = (ImVec2 *)(*(pIVar4->IO).MemAllocFn)((long)iVar7 << 3);
    pIVar5 = (this->_Path).Data;
    if (pIVar5 == (ImVec2 *)0x0) {
LAB_0014e4ee:
      pIVar5 = (ImVec2 *)0x0;
      pIVar4 = GImGui;
    }
    else {
      memcpy(pIVar3,pIVar5,(long)(this->_Path).Size << 3);
      pIVar4 = GImGui;
      pIVar5 = (this->_Path).Data;
      if (pIVar5 == (ImVec2 *)0x0) goto LAB_0014e4ee;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
    }
    (*(pIVar4->IO).MemFreeFn)(pIVar5);
    (this->_Path).Data = pIVar3;
    (this->_Path).Capacity = iVar7;
    iVar2 = (this->_Path).Size;
  }
  else {
    pIVar3 = (this->_Path).Data;
  }
  (this->_Path).Size = iVar2 + 1;
  pIVar3[iVar2] = *d;
  AddPolyline(this,(this->_Path).Data,(this->_Path).Size,col,true,thickness,true);
  pIVar4 = GImGui;
  if (-1 < (this->_Path).Capacity) goto LAB_0014e5a1;
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  pIVar5 = (ImVec2 *)(*(pIVar4->IO).MemAllocFn)(0);
  pIVar3 = (this->_Path).Data;
  if (pIVar3 == (ImVec2 *)0x0) {
LAB_0014e58e:
    pIVar3 = (ImVec2 *)0x0;
    pIVar4 = GImGui;
  }
  else {
    memcpy(pIVar5,pIVar3,(long)(this->_Path).Size << 3);
    pIVar4 = GImGui;
    pIVar3 = (this->_Path).Data;
    if (pIVar3 == (ImVec2 *)0x0) goto LAB_0014e58e;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(pIVar4->IO).MemFreeFn)(pIVar3);
  (this->_Path).Data = pIVar5;
  (this->_Path).Capacity = 0;
LAB_0014e5a1:
  (this->_Path).Size = 0;
  return;
}

Assistant:

void ImDrawList::AddQuad(const ImVec2& a, const ImVec2& b, const ImVec2& c, const ImVec2& d, ImU32 col, float thickness)
{
    if ((col >> 24) == 0)
        return;

    PathLineTo(a);
    PathLineTo(b);
    PathLineTo(c);
    PathLineTo(d);
    PathStroke(col, true, thickness);
}